

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::FieldOptions::Swap(FieldOptions *this,FieldOptions *other)

{
  FieldOptions *other_local;
  FieldOptions *this_local;
  
  if (other != this) {
    std::swap<int>(&this->ctype_,&other->ctype_);
    std::swap<bool>(&this->packed_,&other->packed_);
    std::swap<bool>(&this->lazy_,&other->lazy_);
    std::swap<bool>(&this->deprecated_,&other->deprecated_);
    std::swap<std::__cxx11::string*>(&this->experimental_map_key_,&other->experimental_map_key_);
    std::swap<bool>(&this->weak_,&other->weak_);
    RepeatedPtrField<google::protobuf::UninterpretedOption>::Swap
              (&this->uninterpreted_option_,&other->uninterpreted_option_);
    std::swap<unsigned_int>(this->_has_bits_,other->_has_bits_);
    UnknownFieldSet::Swap(&this->_unknown_fields_,&other->_unknown_fields_);
    std::swap<int>(&this->_cached_size_,&other->_cached_size_);
    internal::ExtensionSet::Swap(&this->_extensions_,&other->_extensions_);
  }
  return;
}

Assistant:

void FieldOptions::Swap(FieldOptions* other) {
  if (other != this) {
    std::swap(ctype_, other->ctype_);
    std::swap(packed_, other->packed_);
    std::swap(lazy_, other->lazy_);
    std::swap(deprecated_, other->deprecated_);
    std::swap(experimental_map_key_, other->experimental_map_key_);
    std::swap(weak_, other->weak_);
    uninterpreted_option_.Swap(&other->uninterpreted_option_);
    std::swap(_has_bits_[0], other->_has_bits_[0]);
    _unknown_fields_.Swap(&other->_unknown_fields_);
    std::swap(_cached_size_, other->_cached_size_);
    _extensions_.Swap(&other->_extensions_);
  }
}